

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O1

prsndef * prsxcnd(prscxdef *ctx,prsbdef *binctx)

{
  ushort uVar1;
  int iVar2;
  tokcxdef *ctx_00;
  prsndef *n1;
  prsndef *n2;
  prsndef *n3;
  prsbdef *ppVar3;
  
  ppVar3 = &prsb_or_C;
  if ((ctx->prscxtok->tokcxflg & 4) == 0) {
    ppVar3 = &prsb_or;
  }
  n1 = prsxbin(ctx,ppVar3);
  ctx_00 = ctx->prscxtok;
  iVar2 = (ctx_00->tokcxcur).toktyp;
  while (iVar2 == 0x56) {
    toknext(ctx_00);
    uVar1 = ctx->prscxflg;
    ctx->prscxflg = uVar1 & 0xfffb;
    ppVar3 = &prsb_cma;
    if ((ctx->prscxtok->tokcxflg & 4) != 0) {
      ppVar3 = &prsb_cma_C;
    }
    n2 = prsxbin(ctx,ppVar3);
    ctx->prscxflg = uVar1;
    prsreq(ctx,0x34);
    ppVar3 = &prsb_asi;
    if ((ctx->prscxtok->tokcxflg & 4) != 0) {
      ppVar3 = &prsb_asi_C;
    }
    n3 = prsxbin(ctx,ppVar3);
    n1 = prsnew3(ctx,0x56,n1,n2,n3);
    ctx_00 = ctx->prscxtok;
    iVar2 = (ctx_00->tokcxcur).toktyp;
  }
  return n1;
}

Assistant:

static prsndef *prsxcnd(prscxdef *ctx, prsbdef *binctx)
{
    prsndef *n1, *n2;
    
    VARUSED(binctx);

    n1 = prsxbin(ctx, prs_cmode(ctx) ? &prsb_or_C : &prsb_or);
    for (;;)
    {
        if (ctx->prscxtok->tokcxcur.toktyp != TOKTQUESTION) break;
        toknext(ctx->prscxtok);
        n2 = prsxexp(ctx, FALSE);
        prsreq(ctx, TOKTCOLON);
        n1 = prsnew3(ctx, TOKTQUESTION, n1, n2,
                     prsxbin(ctx, prs_cmode(ctx) ? &prsb_asi_C : &prsb_asi));
    }
    return(n1);
}